

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O2

void __thiscall
AllReduceSockets::AllReduceSockets
          (AllReduceSockets *this,string *pspan_server,size_t punique_id,size_t ptotal,size_t pnode)

{
  (this->super_AllReduce).total = ptotal;
  (this->super_AllReduce).node = pnode;
  (this->super_AllReduce)._vptr_AllReduce = (_func_int **)&PTR__AllReduceSockets_002a5ed0;
  node_socks::node_socks(&this->socks);
  std::__cxx11::string::string((string *)&this->span_server,(string *)pspan_server);
  this->unique_id = punique_id;
  return;
}

Assistant:

AllReduceSockets(std::string pspan_server, const size_t punique_id, size_t ptotal, const size_t pnode)
      : AllReduce(ptotal, pnode), span_server(pspan_server), unique_id(punique_id)
  {
  }